

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O0

SQChar * sqstd_rex_matchnode(SQRex *exp,SQRexNode *node,SQChar *str,SQRexNode *next)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  SQRexNode *pSVar4;
  SQChar *pSVar5;
  SQBool SVar6;
  int *in_RCX;
  SQRexNode *in_RDX;
  SQRex *in_RSI;
  ulong *in_RDI;
  bool bVar7;
  SQChar *streol;
  SQInteger cont;
  SQInteger ce;
  SQInteger cb;
  SQRexNode *subnext;
  SQInteger tempcap;
  SQInteger capture;
  SQChar *cur;
  SQRexNode *n;
  SQRexNode *temp;
  SQChar *asd;
  SQRexNode *gnext;
  SQChar *stop;
  SQChar *good;
  SQChar *s;
  SQInteger nmaches;
  SQInteger p1;
  SQInteger p0;
  SQRexNode *greedystop;
  SQRexNodeType type;
  SQChar in_stack_ffffffffffffff0f;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 in_stack_ffffffffffffff14;
  SQRex *in_stack_ffffffffffffff18;
  SQRexNode *local_e0;
  long local_c0;
  ulong local_98;
  long local_88;
  long local_80;
  SQRexNode *local_60;
  ulong local_50;
  int *local_38;
  undefined4 in_stack_ffffffffffffffd0;
  SQRexNode *local_8;
  
  iVar1 = *(int *)&in_RSI->_eol;
  local_8 = in_RDX;
  switch(iVar1) {
  case 0x100:
    uVar2 = (long)in_RSI->_p >> 0x10 & 0xffff;
    uVar3 = (ulong)in_RSI->_p & 0xffff;
    local_50 = 0;
    local_60 = in_RDX;
    local_38 = in_RCX;
    if (in_RSI->_first != -1) {
      local_38 = (int *)(in_RDI[5] + in_RSI->_first * 0x20);
      local_60 = in_RDX;
    }
    do {
      if (((local_50 != 0xffff && (long)uVar3 <= (long)local_50) ||
          (pSVar4 = (SQRexNode *)
                    sqstd_rex_matchnode(in_RSI,in_RDX,(SQChar *)in_RCX,
                                        (SQRexNode *)CONCAT44(iVar1,in_stack_ffffffffffffffd0)),
          pSVar4 == (SQRexNode *)0x0)) ||
         (((local_50 = local_50 + 1, local_60 = pSVar4, local_38 != (int *)0x0 &&
           (((*local_38 != 0x100 ||
             ((*local_38 == 0x100 && ((*(long *)(local_38 + 4) >> 0x10 & 0xffffU) != 0)))) &&
            (pSVar5 = sqstd_rex_matchnode(in_RSI,in_RDX,(SQChar *)in_RCX,
                                          (SQRexNode *)CONCAT44(iVar1,in_stack_ffffffffffffffd0)),
            pSVar5 != (SQChar *)0x0)))) &&
          ((((uVar2 == uVar3 && (uVar2 == local_50)) ||
            (((long)uVar2 <= (long)local_50 && (uVar3 == 0xffff)))) ||
           (((long)uVar2 <= (long)local_50 && ((long)local_50 <= (long)uVar3)))))))) break;
    } while (pSVar4 < (SQRexNode *)*in_RDI);
    if ((uVar2 == uVar3) && (uVar2 == local_50)) {
      local_8 = local_60;
    }
    else if (((long)local_50 < (long)uVar2) || (uVar3 != 0xffff)) {
      if (((long)local_50 < (long)uVar2) || ((long)uVar3 < (long)local_50)) {
        local_8 = (SQRexNode *)0x0;
      }
      else {
        local_8 = local_60;
      }
    }
    else {
      local_8 = local_60;
    }
    break;
  case 0x101:
    local_80 = in_RDI[5] + (long)in_RSI->_bol * 0x20;
    while (pSVar5 = sqstd_rex_matchnode(in_RSI,in_RDX,(SQChar *)in_RCX,
                                        (SQRexNode *)CONCAT44(iVar1,in_stack_ffffffffffffffd0)),
          pSVar5 != (SQChar *)0x0) {
      if (*(long *)(local_80 + 0x18) == -1) {
        return pSVar5;
      }
      local_80 = in_RDI[5] + *(long *)(local_80 + 0x18) * 0x20;
    }
    local_80 = in_RDI[5] + (long)in_RSI->_p * 0x20;
    while (pSVar5 = sqstd_rex_matchnode(in_RSI,in_RDX,(SQChar *)in_RCX,
                                        (SQRexNode *)CONCAT44(iVar1,in_stack_ffffffffffffffd0)),
          pSVar5 != (SQChar *)0x0) {
      if (*(long *)(local_80 + 0x18) == -1) {
        return pSVar5;
      }
      local_80 = in_RDI[5] + *(long *)(local_80 + 0x18) * 0x20;
    }
    local_8 = (SQRexNode *)0x0;
    break;
  case 0x102:
  case 0x103:
    local_88 = in_RDI[5] + (long)in_RSI->_bol * 0x20;
    local_98 = 0xffffffffffffffff;
    if ((*(int *)&in_RSI->_eol != 0x103) && (in_RSI->_p == (SQChar *)in_RDI[10])) {
      local_98 = in_RDI[10];
      *(SQRexNode **)(in_RDI[9] + local_98 * 0x10) = in_RDX;
      in_RDI[10] = in_RDI[10] + 1;
    }
    uVar2 = in_RDI[10];
    do {
      local_8 = (SQRexNode *)
                sqstd_rex_matchnode(in_RSI,in_RDX,(SQChar *)in_RCX,
                                    (SQRexNode *)CONCAT44(iVar1,in_stack_ffffffffffffffd0));
      if (local_8 == (SQRexNode *)0x0) {
        if (local_98 != 0xffffffffffffffff) {
          *(undefined8 *)(in_RDI[9] + local_98 * 0x10) = 0;
          *(undefined8 *)(in_RDI[9] + local_98 * 0x10 + 8) = 0;
        }
        return (SQChar *)0x0;
      }
      bVar7 = false;
      if (*(long *)(local_88 + 0x18) != -1) {
        local_88 = in_RDI[5] + *(long *)(local_88 + 0x18) * 0x20;
        bVar7 = local_88 != 0;
      }
    } while (bVar7);
    in_RDI[10] = uVar2;
    if (local_98 != 0xffffffffffffffff) {
      *(long *)(in_RDI[9] + local_98 * 0x10 + 8) =
           (long)local_8 - *(long *)(in_RDI[9] + local_98 * 0x10);
    }
    break;
  case 0x104:
    if (in_RDX == (SQRexNode *)*in_RDI) {
      local_8 = (SQRexNode *)0x0;
    }
    else {
      local_8 = (SQRexNode *)((long)&in_RDX->type + 1);
    }
    break;
  case 0x105:
  case 0x107:
    if (in_RDX == (SQRexNode *)*in_RDI) {
      local_8 = (SQRexNode *)0x0;
    }
    else {
      SVar6 = sqstd_rex_matchclass
                        (in_stack_ffffffffffffff18,
                         (SQRexNode *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10),
                         in_stack_ffffffffffffff0f);
      if (SVar6 == 0) {
        bVar7 = iVar1 == 0x107;
      }
      else {
        bVar7 = iVar1 == 0x105;
      }
      if (bVar7) {
        local_8 = (SQRexNode *)((long)&in_RDX->type + 1);
      }
      else {
        local_8 = (SQRexNode *)0x0;
      }
    }
    break;
  case 0x106:
    if (in_RDX == (SQRexNode *)*in_RDI) {
      local_8 = (SQRexNode *)0x0;
    }
    else {
      SVar6 = sqstd_rex_matchcclass
                        ((SQInteger)in_stack_ffffffffffffff18,
                         (SQChar)((uint)in_stack_ffffffffffffff14 >> 0x18));
      if (SVar6 == 0) {
        local_8 = (SQRexNode *)0x0;
      }
      else {
        local_8 = (SQRexNode *)((long)&in_RDX->type + 1);
      }
    }
    break;
  default:
    if (in_RDX == (SQRexNode *)*in_RDI) {
      local_8 = (SQRexNode *)0x0;
    }
    else if ((int)(char)in_RDX->type == *(int *)&in_RSI->_eol) {
      local_8 = (SQRexNode *)((long)&in_RDX->type + 1);
    }
    else {
      local_8 = (SQRexNode *)0x0;
    }
    break;
  case 0x10a:
    if (in_RDX != (SQRexNode *)*in_RDI) {
      local_8 = (SQRexNode *)0x0;
    }
    break;
  case 0x10b:
    if (in_RDX != (SQRexNode *)in_RDI[1]) {
      local_8 = (SQRexNode *)0x0;
    }
    break;
  case 0x10c:
    local_e0 = in_RDX;
    if ((((in_RDX == (SQRexNode *)in_RDI[1]) &&
         (iVar1 = isspace((int)(char)in_RDX->type), local_e0 = in_RDX, iVar1 == 0)) ||
        ((local_e0 == (SQRexNode *)*in_RDI &&
         (iVar1 = isspace((int)*(char *)((long)&local_e0[-1].next + 7)), iVar1 == 0)))) ||
       (((iVar1 = isspace((int)(char)local_e0->type), iVar1 == 0 &&
         (iVar1 = isspace((int)*(char *)((long)&local_e0->type + 1)), iVar1 != 0)) ||
        ((iVar1 = isspace((int)(char)local_e0->type), iVar1 != 0 &&
         (iVar1 = isspace((int)*(char *)((long)&local_e0->type + 1)), iVar1 == 0)))))) {
      if (in_RSI->_bol != (SQChar *)0x62) {
        local_e0 = (SQRexNode *)0x0;
      }
      local_8 = local_e0;
    }
    else {
      local_8 = local_e0;
      if (in_RSI->_bol == (SQChar *)0x62) {
        local_8 = (SQRexNode *)0x0;
      }
    }
    break;
  case 0x10d:
    if ((SQChar *)(long)(char)in_RDX->type == in_RSI->_bol) {
      local_c0 = 1;
      do {
        while( true ) {
          pSVar4 = in_RDX;
          in_RDX = (SQRexNode *)((long)&pSVar4->type + 1);
          if ((SQRexNode *)*in_RDI <= in_RDX) {
            return (SQChar *)0x0;
          }
          if ((SQChar *)(long)(char)in_RDX->type == in_RSI->_p) break;
          if ((SQChar *)(long)(char)in_RDX->type == in_RSI->_bol) {
            local_c0 = local_c0 + 1;
          }
        }
        local_c0 = local_c0 + -1;
      } while (local_c0 != 0);
      local_8 = (SQRexNode *)((long)&pSVar4->type + 2);
    }
    else {
      local_8 = (SQRexNode *)0x0;
    }
  }
  return (SQChar *)local_8;
}

Assistant:

static const SQChar *sqstd_rex_matchnode(SQRex* exp,SQRexNode *node,const SQChar *str,SQRexNode *next)
{

    SQRexNodeType type = node->type;
    switch(type) {
    case OP_GREEDY: {
        //SQRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
        SQRexNode *greedystop = NULL;
        SQInteger p0 = (node->right >> 16)&0x0000FFFF, p1 = node->right&0x0000FFFF, nmaches = 0;
        const SQChar *s=str, *good = str;

        if(node->next != -1) {
            greedystop = &exp->_nodes[node->next];
        }
        else {
            greedystop = next;
        }

        while((nmaches == 0xFFFF || nmaches < p1)) {

            const SQChar *stop;
            if(!(s = sqstd_rex_matchnode(exp,&exp->_nodes[node->left],s,greedystop)))
                break;
            nmaches++;
            good=s;
            if(greedystop) {
                //checks that 0 matches satisfy the expression(if so skips)
                //if not would always stop(for instance if is a '?')
                if(greedystop->type != OP_GREEDY ||
                (greedystop->type == OP_GREEDY && ((greedystop->right >> 16)&0x0000FFFF) != 0))
                {
                    SQRexNode *gnext = NULL;
                    if(greedystop->next != -1) {
                        gnext = &exp->_nodes[greedystop->next];
                    }else if(next && next->next != -1){
                        gnext = &exp->_nodes[next->next];
                    }
                    stop = sqstd_rex_matchnode(exp,greedystop,s,gnext);
                    if(stop) {
                        //if satisfied stop it
                        if(p0 == p1 && p0 == nmaches) break;
                        else if(nmaches >= p0 && p1 == 0xFFFF) break;
                        else if(nmaches >= p0 && nmaches <= p1) break;
                    }
                }
            }

            if(s >= exp->_eol)
                break;
        }
        if(p0 == p1 && p0 == nmaches) return good;
        else if(nmaches >= p0 && p1 == 0xFFFF) return good;
        else if(nmaches >= p0 && nmaches <= p1) return good;
        return NULL;
    }
    case OP_OR: {
            const SQChar *asd = str;
            SQRexNode *temp=&exp->_nodes[node->left];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            asd = str;
            temp = &exp->_nodes[node->right];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            return NULL;
            break;
    }
    case OP_EXPR:
    case OP_NOCAPEXPR:{
            SQRexNode *n = &exp->_nodes[node->left];
            const SQChar *cur = str;
            SQInteger capture = -1;
            if(node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
                capture = exp->_currsubexp;
                exp->_matches[capture].begin = cur;
                exp->_currsubexp++;
            }
            SQInteger tempcap = exp->_currsubexp;
            do {
                SQRexNode *subnext = NULL;
                if(n->next != -1) {
                    subnext = &exp->_nodes[n->next];
                }else {
                    subnext = next;
                }
                if(!(cur = sqstd_rex_matchnode(exp,n,cur,subnext))) {
                    if(capture != -1){
                        exp->_matches[capture].begin = 0;
                        exp->_matches[capture].len = 0;
                    }
                    return NULL;
                }
            } while((n->next != -1) && (n = &exp->_nodes[n->next]));

            exp->_currsubexp = tempcap;
            if(capture != -1)
                exp->_matches[capture].len = cur - exp->_matches[capture].begin;
            return cur;
    }
    case OP_WB:
        if((str == exp->_bol && !isspace(*str))
         || (str == exp->_eol && !isspace(*(str-1)))
         || (!isspace(*str) && isspace(*(str+1)))
         || (isspace(*str) && !isspace(*(str+1))) ) {
            return (node->left == 'b')?str:NULL;
        }
        return (node->left == 'b')?NULL:str;
    case OP_BOL:
        if(str == exp->_bol) return str;
        return NULL;
    case OP_EOL:
        if(str == exp->_eol) return str;
        return NULL;
    case OP_DOT:{
        if (str == exp->_eol) return NULL;
        str++;
                }
        return str;
    case OP_NCLASS:
    case OP_CLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchclass(exp,&exp->_nodes[node->left],*str)?(type == OP_CLASS?SQTrue:SQFalse):(type == OP_NCLASS?SQTrue:SQFalse)) {
            str++;
            return str;
        }
        return NULL;
    case OP_CCLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchcclass(node->left,*str)) {
            str++;
            return str;
        }
        return NULL;
    case OP_MB:
        {
            SQInteger cb = node->left; //char that opens a balanced expression
            if(*str != cb) return NULL; // string doesnt start with open char
            SQInteger ce = node->right; //char that closes a balanced expression
            SQInteger cont = 1;
            const SQChar *streol = exp->_eol;
            while (++str < streol) {
              if (*str == ce) {
                if (--cont == 0) {
                    return ++str;
                }
              }
              else if (*str == cb) cont++;
            }
        }
        return NULL; // string ends out of balance
    default: /* char */
        if (str == exp->_eol) return NULL;
        if(*str != node->type) return NULL;
        str++;
        return str;
    }
    return NULL;
}